

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O3

bool crnlib::command_line_params::load_string_file(char *pFilename,dynamic_string_array *strings)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *p;
  dynamic_string ansi_str;
  cfile_stream in_stream;
  dynamic_string local_90;
  dynamic_string local_80;
  cfile_stream local_70;
  
  data_stream::data_stream(&local_70.super_data_stream);
  local_70.super_data_stream._vptr_data_stream = (_func_int **)&PTR__cfile_stream_001d1f30;
  local_70.m_pFile = (FILE *)0x0;
  local_70.m_size._0_1_ = 0;
  local_70.m_size._1_7_ = 0;
  local_70.m_ofs._0_1_ = 0;
  local_70._49_8_ = 0;
  iVar2 = cfile_stream::open(&local_70,pFilename,5,0);
  if (SUB41(iVar2,0) == false) {
    console::error("Unable to open file \"%s\" for reading!",pFilename);
  }
  else {
    local_90.m_buf_size = 0;
    local_90.m_len = 0;
    local_90.m_pStr = (char *)0x0;
    while( true ) {
      bVar1 = data_stream::read_line(&local_70.super_data_stream,&local_90);
      if (!bVar1) break;
      dynamic_string::trim(&local_90);
      if (local_90.m_len != 0) {
        p = local_90.m_pStr;
        if (local_90.m_pStr == (char *)0x0) {
          p = "";
        }
        dynamic_string::dynamic_string(&local_80,p);
        uVar3 = strings->m_size;
        if (strings->m_capacity <= uVar3) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)strings,uVar3 + 1,true,0x10,(object_mover)0x0,false);
          uVar3 = strings->m_size;
        }
        dynamic_string::dynamic_string(strings->m_p + uVar3,&local_80);
        strings->m_size = strings->m_size + 1;
        if ((local_80.m_pStr != (char *)0x0) &&
           ((*(uint *)(local_80.m_pStr + -8) ^ *(uint *)(local_80.m_pStr + -4)) == 0xffffffff)) {
          crnlib_free(local_80.m_pStr + -0x10);
        }
      }
    }
    if ((local_90.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_90.m_pStr + -8) ^ *(uint *)(local_90.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_90.m_pStr + -0x10);
    }
  }
  cfile_stream::~cfile_stream(&local_70);
  return SUB41(iVar2,0);
}

Assistant:

bool command_line_params::load_string_file(const char* pFilename, dynamic_string_array& strings)
    {
        cfile_stream in_stream;
        if (!in_stream.open(pFilename, cDataStreamReadable | cDataStreamSeekable))
        {
            console::error("Unable to open file \"%s\" for reading!", pFilename);
            return false;
        }

        dynamic_string ansi_str;

        for (;;)
        {
            if (!in_stream.read_line(ansi_str))
            {
                break;
            }
            ansi_str.trim();
            if (ansi_str.is_empty())
            {
                continue;
            }
            strings.push_back(dynamic_string(ansi_str.get_ptr()));
        }

        return true;
    }